

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillEdgeCent(Level *this,Array<MultiCutFab_*,_3> *a_edgecent,Geometry *geom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  const_reference ppMVar4;
  reference pvVar5;
  BoxArray *pBVar6;
  DistributionMapping *pDVar7;
  Level *in_RDI;
  int idim_2;
  MultiCutFab *edgecent;
  int idim_1;
  Array<MultiFab,_3> tmp;
  int idim;
  undefined8 *in_stack_fffffffffffffa98;
  array<amrex::MultiFab,_3UL> *in_stack_fffffffffffffaa0;
  array<amrex::MultiFab,_3UL> *in_stack_fffffffffffffab0;
  array<amrex::MultiFab,_3UL> *this_00;
  int local_50c;
  undefined8 local_4e0;
  undefined8 local_4d8 [4];
  element_type *local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  int local_4a4;
  RefID in_stack_fffffffffffffbd0;
  MultiCutFab *in_stack_fffffffffffffbd8;
  MultiFab *in_stack_fffffffffffffc00;
  MultiCutFab *in_stack_fffffffffffffc08;
  MultiArray4<double> in_stack_fffffffffffffda0;
  MultiArray4<const_double> in_stack_fffffffffffffda8;
  Level *in_stack_fffffffffffffdb0;
  int local_1c;
  
  bVar1 = isAllRegular(in_RDI);
  if (bVar1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffaa0,
                 (size_type)in_stack_fffffffffffffa98);
      MultiCutFab::setVal(in_stack_fffffffffffffbd8,(Real)in_stack_fffffffffffffbd0.data);
    }
  }
  else {
    std::array<amrex::MultiFab,_3UL>::array(in_stack_fffffffffffffab0);
    for (local_4a4 = 0; local_4a4 < 3; local_4a4 = local_4a4 + 1) {
      ppMVar4 = std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                          ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffaa0,
                           (size_type)in_stack_fffffffffffffa98);
      local_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppMVar4;
      pvVar5 = std::array<amrex::MultiFab,_3UL>::operator[]
                         (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
      pBVar6 = MultiCutFab::boxArray((MultiCutFab *)0x14a5ef6);
      pDVar7 = MultiCutFab::DistributionMap((MultiCutFab *)0x14a5f08);
      uVar2 = MultiCutFab::nComp((MultiCutFab *)0x14a5f1a);
      uVar3 = MultiCutFab::nGrow((MultiCutFab *)0x14a5f2b);
      local_4d8[2] = 0;
      local_4d8[3] = 0;
      local_4d8[0] = 0;
      local_4d8[1] = 0;
      local_4b8 = (element_type *)0x0;
      MFInfo::MFInfo((MFInfo *)0x14a5f60);
      local_4e0 = 0;
      in_stack_fffffffffffffa98 = &local_4e0;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffaa0);
      (*(pvVar5->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                (pvVar5,pBVar6,pDVar7,(ulong)uVar2,(ulong)uVar3,local_4d8);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x14a5fbe);
      MFInfo::~MFInfo((MFInfo *)0x14a5fcb);
    }
    this_00 = (array<amrex::MultiFab,_3UL> *)&stack0xfffffffffffffaf8;
    GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
              (in_stack_fffffffffffffaa0);
    fillEdgeCent(in_stack_fffffffffffffdb0,(Array<MultiFab_*,_3> *)in_stack_fffffffffffffda8.hp,
                 (Geometry *)in_stack_fffffffffffffda0.hp);
    for (local_50c = 0; local_50c < 3; local_50c = local_50c + 1) {
      std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffaa0,
                 (size_type)in_stack_fffffffffffffa98);
      std::array<amrex::MultiFab,_3UL>::operator[]
                (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
      anon_unknown_2::copyMultiFabToMultiCutFab(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00)
      ;
    }
    std::array<amrex::MultiFab,_3UL>::~array(this_00);
  }
  return;
}

Assistant:

void
Level::fillEdgeCent (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_edgecent, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_edgecent[idim]->setVal(1.0);
        }
        return;
    }

    Array<MultiFab,AMREX_SPACEDIM> tmp;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        MultiCutFab const& edgecent = *a_edgecent[idim];
        tmp[idim].define(edgecent.boxArray(), edgecent.DistributionMap(),
                         edgecent.nComp(), edgecent.nGrow());
    }

    fillEdgeCent(GetArrOfPtrs(tmp), geom);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        copyMultiFabToMultiCutFab(*a_edgecent[idim], tmp[idim]);
    }
}